

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

void __thiscall smf::MidiEventList::removeEmpties(MidiEventList *this)

{
  pointer ppMVar1;
  MidiEvent *this_00;
  pointer ppMVar2;
  pointer ppMVar3;
  int iVar4;
  ulong uVar5;
  int i_1;
  int i;
  long lVar6;
  long lVar7;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> newlist;
  _Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> local_48;
  
  lVar6 = 0;
  iVar4 = 0;
  while( true ) {
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->list).
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppMVar1;
    if ((int)(uVar5 >> 3) <= lVar6) break;
    this_00 = ppMVar1[lVar6];
    if ((this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      MidiEvent::~MidiEvent(this_00);
      operator_delete(this_00);
      (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = (MidiEvent *)0x0;
      iVar4 = iVar4 + 1;
    }
    lVar6 = lVar6 + 1;
  }
  if (iVar4 != 0) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&local_48,
               ((long)uVar5 >> 3) - (long)iVar4);
    lVar7 = 0;
    lVar6 = 0;
    while( true ) {
      ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppMVar2 - (long)ppMVar1) >> 3) <= lVar6) break;
      if (*(long *)((long)ppMVar1 + lVar7) != 0) {
        std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                  ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&local_48,
                   (value_type *)((long)ppMVar1 + lVar7));
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 8;
    }
    ppMVar3 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start = ppMVar1;
    local_48._M_impl.super__Vector_impl_data._M_finish = ppMVar2;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = ppMVar3;
    std::_Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~_Vector_base(&local_48)
    ;
  }
  return;
}

Assistant:

void MidiEventList::removeEmpties(void) {
	int count = 0;
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i]->empty()) {
			delete list[i];
			list[i] = NULL;
			count++;
		}
	}
	if (count == 0) {
		return;
	}
	std::vector<MidiEvent*> newlist;
	newlist.reserve(list.size() - count);
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i]) {
			newlist.push_back(list[i]);
		}
	}
	list.swap(newlist);
}